

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void amrex::Amr::fillStatePlotVarList(void)

{
  int iVar1;
  int iVar2;
  DescriptorList *this;
  StateDescriptor *pSVar3;
  int comp;
  int typ;
  DescriptorList *desc_lst;
  IndexType in_stack_ffffffffffffffd0;
  IndexType in_stack_ffffffffffffffd4;
  int iVar4;
  int k;
  int iVar5;
  IndexType local_4;
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT44(in_stack_ffffffffffffffd4.itype,in_stack_ffffffffffffffd0.itype));
  this = AmrLevel::get_desc_lst();
  k = 0;
  while( true ) {
    iVar5 = k;
    iVar1 = DescriptorList::size((DescriptorList *)0x1380d84);
    if (iVar1 <= k) break;
    iVar1 = 0;
    while( true ) {
      iVar4 = iVar1;
      pSVar3 = DescriptorList::operator[]
                         ((DescriptorList *)
                          CONCAT44(in_stack_ffffffffffffffd4.itype,in_stack_ffffffffffffffd0.itype),
                          k);
      iVar2 = StateDescriptor::nComp(pSVar3);
      if (iVar2 <= iVar1) break;
      pSVar3 = DescriptorList::operator[]
                         ((DescriptorList *)
                          CONCAT44(in_stack_ffffffffffffffd4.itype,in_stack_ffffffffffffffd0.itype),
                          k);
      in_stack_ffffffffffffffd4 = StateDescriptor::getType(pSVar3);
      IndexType::IndexType(&local_4,CELL,CELL,CELL);
      in_stack_ffffffffffffffd0.itype = local_4.itype;
      if (local_4.itype == in_stack_ffffffffffffffd4.itype) {
        DescriptorList::operator[]
                  ((DescriptorList *)CONCAT44(in_stack_ffffffffffffffd4.itype,local_4.itype),k);
        StateDescriptor::name_abi_cxx11_
                  ((StateDescriptor *)
                   CONCAT44(in_stack_ffffffffffffffd4.itype,in_stack_ffffffffffffffd0.itype),k);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this,(value_type *)CONCAT44(iVar5,iVar4));
      }
      iVar1 = iVar4 + 1;
    }
    k = iVar5 + 1;
  }
  return;
}

Assistant:

void
Amr::fillStatePlotVarList ()
{
    state_plot_vars.clear();
    const DescriptorList &desc_lst = AmrLevel::get_desc_lst();
    for (int typ(0); typ < desc_lst.size(); ++typ) {
        for (int comp(0); comp < desc_lst[typ].nComp(); ++comp) {
            if (desc_lst[typ].getType() == IndexType::TheCellType()) {
                state_plot_vars.push_back(desc_lst[typ].name(comp));
            }
        }
    }
}